

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string_view __thiscall
google::protobuf::Reflection::GetStringViewImpl
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  void *pvVar1;
  bool bVar2;
  CppStringType CVar3;
  uint32_t uVar4;
  OneofDescriptor *pOVar5;
  Cord **ppCVar6;
  ArenaStringPtr *pAVar7;
  string *psVar8;
  Cord *cord;
  string_view sVar9;
  LogMessageFatal local_30;
  
  if ((field->field_0x1 & 8) != 0) {
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    psVar8 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                        field->number_,(field->field_20).default_value_string_);
    goto LAB_001c2452;
  }
  pOVar5 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar5 == (OneofDescriptor *)0x0) {
LAB_001c23e4:
    CVar3 = FieldDescriptor::cpp_string_type(field);
    if (CVar3 == kCord) {
      pOVar5 = FieldDescriptor::real_containing_oneof(field);
      if (pOVar5 == (OneofDescriptor *)0x0) {
        cord = GetRaw<absl::lts_20250127::Cord>(this,message,field);
      }
      else {
        ppCVar6 = GetRaw<absl::lts_20250127::Cord*>(this,message,field);
        cord = *ppCVar6;
      }
      if (scratch != (ScratchSpace *)0x0) {
        sVar9 = ScratchSpace::CopyFromCord(scratch,cord);
        return sVar9;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x7e7,"scratch");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
    }
    pAVar7 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    pvVar1 = (pAVar7->tagged_ptr_).ptr_;
    if (((ulong)pvVar1 & 3) != 0) {
      psVar8 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
      goto LAB_001c2452;
    }
  }
  else {
    bVar2 = HasOneofField(this,message,field);
    if (bVar2) goto LAB_001c23e4;
  }
  psVar8 = (field->field_20).default_value_string_;
LAB_001c2452:
  sVar9._M_str = (psVar8->_M_dataplus)._M_p;
  sVar9._M_len = psVar8->_M_string_length;
  return sVar9;
}

Assistant:

absl::string_view Reflection::GetStringViewImpl(const Message& message,
                                                const FieldDescriptor* field,
                                                ScratchSpace* scratch) const {
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  }
  if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    return field->default_value_string();
  }

  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      const auto& cord = schema_.InRealOneof(field)
                             ? *GetField<absl::Cord*>(message, field)
                             : GetField<absl::Cord>(message, field);
      ABSL_DCHECK(scratch);
      return scratch->CopyFromCord(cord);
    }
    default:
      auto str = GetField<ArenaStringPtr>(message, field);
      return str.IsDefault() ? field->default_value_string() : str.Get();
  }
}